

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13161f6::MinMaxTest_MinValue_Test::TestBody(MinMaxTest_MinValue_Test *this)

{
  bool bVar1;
  AssertHelper *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int max;
  int min;
  uint8_t b [64];
  uint8_t a [64];
  int i;
  AssertHelper *in_stack_fffffffffffffeb0;
  AssertionResult *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  char *in_stack_fffffffffffffec8;
  AssertionResult *this_00;
  Type in_stack_fffffffffffffedc;
  AssertionResult local_108 [2];
  undefined4 local_e4;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff28;
  AssertHelper *in_stack_ffffffffffffff30;
  RegisterStateCheckMMX local_be;
  undefined1 local_a0 [4];
  undefined1 local_9c [4];
  undefined1 local_98 [64];
  undefined1 local_58 [76];
  int local_c;
  
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    memset(local_58,0,0x40);
    memset(local_98,0xff,0x40);
    local_98[local_c] = (char)local_c;
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_be);
    (*(code *)(((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&in_RDI[3].data_)->_M_t).
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl)(local_58,8,local_98,8,local_9c,local_a0);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbc1f76);
    local_e4 = 0xff;
    this_00 = (AssertionResult *)&stack0xffffffffffffff20;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffec8,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (int *)in_stack_fffffffffffffeb8,(int *)in_stack_fffffffffffffeb0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    in_stack_fffffffffffffedc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
    if (!bVar1) {
      testing::Message::Message((Message *)in_RDI);
      in_stack_fffffffffffffec8 =
           testing::AssertionResult::failure_message((AssertionResult *)0xbc201c);
      testing::internal::AssertHelper::AssertHelper
                (in_RDI,in_stack_fffffffffffffedc,&this_00->success_,
                 (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffeb0);
      testing::Message::~Message((Message *)0xbc206a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc20b6);
    in_stack_fffffffffffffeb8 = local_108;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffec8,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (int *)in_stack_fffffffffffffeb8,(int *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffec7 =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffeb8);
    if (!(bool)in_stack_fffffffffffffec7) {
      testing::Message::Message((Message *)in_RDI);
      in_stack_fffffffffffffeb0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbc2140);
      testing::internal::AssertHelper::AssertHelper
                (in_RDI,in_stack_fffffffffffffedc,&this_00->success_,
                 (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff30,(Message *)in_stack_ffffffffffffff28._M_head_impl);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffeb0);
      testing::Message::~Message((Message *)0xbc218e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc21da);
  }
  return;
}

Assistant:

TEST_P(MinMaxTest, MinValue) {
  for (int i = 0; i < 64; i++) {
    uint8_t a[64], b[64];
    memset(a, 0, sizeof(a));
    memset(b, 255, sizeof(b));
    b[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(255, max);
    EXPECT_EQ(i, min);
  }
}